

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeCopMemInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t RegNo;
  uint32_t uVar4;
  uint uVar5;
  DecodeStatus DVar6;
  uint uVar7;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint U;
  uint Rn;
  uint imm;
  uint coproc;
  uint CRd;
  uint pred;
  DecodeStatus S;
  uint uVar8;
  uint numBits;
  DecodeStatus local_2c [6];
  uint32_t local_14;
  MCInst *local_10;
  
  local_2c[0] = MCDisassembler_Success;
  numBits = 4;
  local_14 = in_ESI;
  local_10 = in_RDI;
  fieldFromInstruction_4(in_ESI,0x1c,4);
  uVar2 = fieldFromInstruction_4(local_14,0xc,numBits);
  uVar8 = 8;
  uVar3 = fieldFromInstruction_4(local_14,8,numBits);
  RegNo = fieldFromInstruction_4(local_14,0,uVar8);
  fieldFromInstruction_4(local_14,0x10,numBits);
  uVar4 = fieldFromInstruction_4(local_14,0x17,1);
  uVar5 = MCInst_getOpcode(local_10);
  if (((((uVar5 - 0x8a < 8) || (uVar5 - 0x18d < 8)) || (uVar5 - 0x93d < 8)) || (uVar5 - 0xa1e < 8))
     && ((uVar3 == 10 || (uVar3 == 0xb)))) {
    return MCDisassembler_Fail;
  }
  MCOperand_CreateImm0(local_10,(ulong)uVar3);
  MCOperand_CreateImm0(local_10,(ulong)uVar2);
  DVar6 = DecodeGPRRegisterClass
                    ((MCInst *)CONCAT44(uVar2,uVar3),RegNo,CONCAT44(uVar4,uVar5),
                     (void *)CONCAT44(numBits,uVar8));
  _Var1 = Check(local_2c,DVar6);
  if (!_Var1) {
    return MCDisassembler_Fail;
  }
  uVar8 = MCInst_getOpcode(local_10);
  if (uVar8 == 0x82) {
LAB_0027c0b0:
    uVar7 = ARM_AM_getAM5Opc((uint)(uVar4 != 0),(uchar)RegNo);
    MCOperand_CreateImm0(local_10,(ulong)uVar7);
  }
  else {
    if (uVar8 == 0x84) {
LAB_0027c0e3:
      RegNo = uVar4 << 8 | RegNo;
    }
    else {
      if (uVar8 - 0x85 < 2) goto LAB_0027c0b0;
      if (uVar8 == 0x88) goto LAB_0027c0e3;
      if (uVar8 - 0x89 < 2) goto LAB_0027c0b0;
      if (uVar8 == 0x8c) goto LAB_0027c0e3;
      if (uVar8 - 0x8d < 2) goto LAB_0027c0b0;
      if (uVar8 == 0x90) goto LAB_0027c0e3;
      if ((uVar8 == 0x91) || (uVar8 == 0x185)) goto LAB_0027c0b0;
      if (uVar8 == 0x187) goto LAB_0027c0e3;
      if (uVar8 - 0x188 < 2) goto LAB_0027c0b0;
      if (uVar8 == 0x18b) goto LAB_0027c0e3;
      if (uVar8 - 0x18c < 2) goto LAB_0027c0b0;
      if (uVar8 == 399) goto LAB_0027c0e3;
      if (uVar8 - 400 < 2) goto LAB_0027c0b0;
      if (uVar8 == 0x193) goto LAB_0027c0e3;
      if ((uVar8 == 0x194) || (uVar8 == 0x935)) goto LAB_0027c0b0;
      if (uVar8 == 0x937) goto LAB_0027c0e3;
      if (uVar8 - 0x938 < 2) goto LAB_0027c0b0;
      if (uVar8 == 0x93b) goto LAB_0027c0e3;
      if (uVar8 - 0x93c < 2) goto LAB_0027c0b0;
      if (uVar8 == 0x93f) goto LAB_0027c0e3;
      if (uVar8 - 0x940 < 2) goto LAB_0027c0b0;
      if (uVar8 == 0x943) goto LAB_0027c0e3;
      if ((uVar8 == 0x944) || (uVar8 == 0xa16)) goto LAB_0027c0b0;
      if (uVar8 == 0xa18) goto LAB_0027c0e3;
      if (uVar8 - 0xa19 < 2) goto LAB_0027c0b0;
      if (uVar8 == 0xa1c) goto LAB_0027c0e3;
      if (uVar8 - 0xa1d < 2) goto LAB_0027c0b0;
      if (uVar8 == 0xa20) goto LAB_0027c0e3;
      if (uVar8 - 0xa21 < 2) goto LAB_0027c0b0;
      if (uVar8 == 0xa24) goto LAB_0027c0e3;
      if (uVar8 == 0xa25) goto LAB_0027c0b0;
    }
    MCOperand_CreateImm0(local_10,(ulong)RegNo);
  }
  uVar7 = MCInst_getOpcode(local_10);
  if ((uVar7 - 0x8a < 8) || (uVar7 - 0x18d < 8)) {
    DVar6 = DecodePredicateOperand
                      ((MCInst *)CONCAT44(uVar4,uVar5),numBits,CONCAT44(uVar8,uVar7),
                       (void *)0x27c146);
    _Var1 = Check(local_2c,DVar6);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  return local_2c[0];
}

Assistant:

static DecodeStatus DecodeCopMemInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned CRd = fieldFromInstruction_4(Insn, 12, 4);
	unsigned coproc = fieldFromInstruction_4(Insn, 8, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 8);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned U = fieldFromInstruction_4(Insn, 23, 1);

	switch (MCInst_getOpcode(Inst)) {
		case ARM_LDC_OFFSET:
		case ARM_LDC_PRE:
		case ARM_LDC_POST:
		case ARM_LDC_OPTION:
		case ARM_LDCL_OFFSET:
		case ARM_LDCL_PRE:
		case ARM_LDCL_POST:
		case ARM_LDCL_OPTION:
		case ARM_STC_OFFSET:
		case ARM_STC_PRE:
		case ARM_STC_POST:
		case ARM_STC_OPTION:
		case ARM_STCL_OFFSET:
		case ARM_STCL_PRE:
		case ARM_STCL_POST:
		case ARM_STCL_OPTION:
		case ARM_t2LDC_OFFSET:
		case ARM_t2LDC_PRE:
		case ARM_t2LDC_POST:
		case ARM_t2LDC_OPTION:
		case ARM_t2LDCL_OFFSET:
		case ARM_t2LDCL_PRE:
		case ARM_t2LDCL_POST:
		case ARM_t2LDCL_OPTION:
		case ARM_t2STC_OFFSET:
		case ARM_t2STC_PRE:
		case ARM_t2STC_POST:
		case ARM_t2STC_OPTION:
		case ARM_t2STCL_OFFSET:
		case ARM_t2STCL_PRE:
		case ARM_t2STCL_POST:
		case ARM_t2STCL_OPTION:
			if (coproc == 0xA || coproc == 0xB)
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	MCOperand_CreateImm0(Inst, coproc);
	MCOperand_CreateImm0(Inst, CRd);
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2LDC2_OFFSET:
		case ARM_t2LDC2L_OFFSET:
		case ARM_t2LDC2_PRE:
		case ARM_t2LDC2L_PRE:
		case ARM_t2STC2_OFFSET:
		case ARM_t2STC2L_OFFSET:
		case ARM_t2STC2_PRE:
		case ARM_t2STC2L_PRE:
		case ARM_LDC2_OFFSET:
		case ARM_LDC2L_OFFSET:
		case ARM_LDC2_PRE:
		case ARM_LDC2L_PRE:
		case ARM_STC2_OFFSET:
		case ARM_STC2L_OFFSET:
		case ARM_STC2_PRE:
		case ARM_STC2L_PRE:
		case ARM_t2LDC_OFFSET:
		case ARM_t2LDCL_OFFSET:
		case ARM_t2LDC_PRE:
		case ARM_t2LDCL_PRE:
		case ARM_t2STC_OFFSET:
		case ARM_t2STCL_OFFSET:
		case ARM_t2STC_PRE:
		case ARM_t2STCL_PRE:
		case ARM_LDC_OFFSET:
		case ARM_LDCL_OFFSET:
		case ARM_LDC_PRE:
		case ARM_LDCL_PRE:
		case ARM_STC_OFFSET:
		case ARM_STCL_OFFSET:
		case ARM_STC_PRE:
		case ARM_STCL_PRE:
			imm = ARM_AM_getAM5Opc(U ? ARM_AM_add : ARM_AM_sub, (unsigned char)imm);
			MCOperand_CreateImm0(Inst, imm);
			break;
		case ARM_t2LDC2_POST:
		case ARM_t2LDC2L_POST:
		case ARM_t2STC2_POST:
		case ARM_t2STC2L_POST:
		case ARM_LDC2_POST:
		case ARM_LDC2L_POST:
		case ARM_STC2_POST:
		case ARM_STC2L_POST:
		case ARM_t2LDC_POST:
		case ARM_t2LDCL_POST:
		case ARM_t2STC_POST:
		case ARM_t2STCL_POST:
		case ARM_LDC_POST:
		case ARM_LDCL_POST:
		case ARM_STC_POST:
		case ARM_STCL_POST:
			imm |= U << 8;
			// fall through.
		default:
			// The 'option' variant doesn't encode 'U' in the immediate since
			// the immediate is unsigned [0,255].
			MCOperand_CreateImm0(Inst, imm);
			break;
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_LDC_OFFSET:
		case ARM_LDC_PRE:
		case ARM_LDC_POST:
		case ARM_LDC_OPTION:
		case ARM_LDCL_OFFSET:
		case ARM_LDCL_PRE:
		case ARM_LDCL_POST:
		case ARM_LDCL_OPTION:
		case ARM_STC_OFFSET:
		case ARM_STC_PRE:
		case ARM_STC_POST:
		case ARM_STC_OPTION:
		case ARM_STCL_OFFSET:
		case ARM_STCL_PRE:
		case ARM_STCL_POST:
		case ARM_STCL_OPTION:
			if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	return S;
}